

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_compute_fprf_float64(TCGContext_conflict10 *tcg_ctx,TCGv_i64 arg)

{
  TCGv_i64 arg_local;
  TCGContext_conflict10 *tcg_ctx_local;
  
  gen_helper_compute_fprf_float64(tcg_ctx,tcg_ctx->cpu_env,arg);
  gen_helper_float_check_status(tcg_ctx,tcg_ctx->cpu_env);
  return;
}

Assistant:

static inline void gen_compute_fprf_float64(TCGContext *tcg_ctx, TCGv_i64 arg)
{
    gen_helper_compute_fprf_float64(tcg_ctx, tcg_ctx->cpu_env, arg);
    gen_helper_float_check_status(tcg_ctx, tcg_ctx->cpu_env);
}